

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.cpp
# Opt level: O2

void __thiscall cpp_db::transaction::commit(transaction *this)

{
  shared_ptr<cpp_db::connection_interface> sVar1;
  undefined8 local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_30 [2];
  long *local_20;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  (*((this->trans_impl).
     super___shared_ptr<cpp_db::transaction_interface,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_transaction_interface[3])();
  sVar1 = tools::lock_or_throw<cpp_db::connection_interface>
                    ((tools *)&local_20,&this->conn_impl,"Invalid database connection");
  local_38 = 0;
  a_Stack_30[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (**(code **)(*local_20 + 0x30))
            (local_20,&local_38,
             sVar1.super___shared_ptr<cpp_db::connection_interface,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi._M_pi);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18);
  return;
}

Assistant:

void transaction::commit()
{
	trans_impl->commit();
    tools::lock_or_throw(conn_impl, "Invalid database connection")->set_current_transaction(nullptr);
}